

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  KeyInfo *pKVar5;
  MemPage *pMVar6;
  long lVar7;
  int iVar8;
  uchar *pBuf;
  ulong uVar9;
  uint uVar10;
  char cVar11;
  uint uVar12;
  u8 *puVar13;
  int *piVar14;
  uint uVar15;
  u32 amt;
  bool bVar16;
  i64 nCellKey;
  int local_8c;
  code *local_78;
  int local_70;
  uint local_6c;
  u64 local_38;
  
  piVar14 = pRes;
  if (pIdxKey == (UnpackedRecord *)0x0) {
    if ((pCur->eState == '\x01') && ((pCur->curFlags & 2) != 0)) {
      lVar7 = (pCur->info).nKey;
      if (lVar7 == intKey) {
        *pRes = 0;
        return 0;
      }
      if (lVar7 < intKey) {
        if ((pCur->curFlags & 8) != 0) goto LAB_00136d32;
        if ((lVar7 + 1 == intKey) && (pCur->skipNext == 0)) {
          *pRes = 0;
          iVar8 = sqlite3BtreeNext(pCur,pRes);
          if (iVar8 != 0) {
            return iVar8;
          }
          if ((*pRes == 0) && (getCellInfo(pCur), (pCur->info).nKey == intKey)) {
            return 0;
          }
        }
      }
    }
    local_78 = (code *)0x0;
  }
  else {
    pKVar5 = pIdxKey->pKeyInfo;
    if ((uint)pKVar5->nXField + (uint)pKVar5->nField < 0xe) {
      uVar4 = pIdxKey->aMem->flags;
      bVar16 = *pKVar5->aSortOrder == '\0';
      pIdxKey->r1 = -bVar16 | 1;
      pIdxKey->r2 = -!bVar16 | 1;
      if ((uVar4 & 4) == 0) {
        if (((uVar4 & 0x19) == 0) && (pKVar5->aColl[0] == (CollSeq *)0x0)) {
          local_78 = vdbeRecordCompareString;
          goto LAB_001367d0;
        }
        bVar16 = true;
      }
      else {
        local_78 = vdbeRecordCompareInt;
LAB_001367d0:
        bVar16 = false;
      }
      if (bVar16) goto LAB_001367db;
    }
    else {
LAB_001367db:
      local_78 = sqlite3VdbeRecordCompare;
    }
    pIdxKey->errCode = '\0';
  }
  iVar8 = moveToRoot(pCur);
  if (iVar8 != 0) {
    return iVar8;
  }
  if (pCur->eState != '\0') {
    local_8c = 0;
    do {
      pMVar6 = pCur->apPage[pCur->iPage];
      iVar8 = pMVar6->nCell - 1;
      uVar10 = iVar8 >> (1U - (char)biasRight & 0x1f);
      pCur->aiIdx[pCur->iPage] = (u16)uVar10;
      if (local_78 == (code *)0x0) {
        uVar15 = 0;
        do {
          puVar13 = pMVar6->aDataOfst +
                    (CONCAT11(pMVar6->aCellIdx[(long)(int)uVar10 * 2],
                              pMVar6->aCellIdx[(long)(int)uVar10 * 2 + 1]) & pMVar6->maskPage);
          if (pMVar6->intKeyLeaf == '\0') {
LAB_00136b18:
            piVar14 = (int *)((ulong)piVar14 & 0xffffffff);
            sqlite3GetVarint(puVar13,&local_38);
            if ((long)local_38 < intKey) {
              uVar15 = uVar10 + 1;
              if ((int)uVar10 < iVar8) {
LAB_00136b52:
                uVar10 = (int)(iVar8 + uVar15) >> 1;
                cVar11 = '\0';
              }
              else {
                piVar14 = (int *)0xffffffff;
                cVar11 = '\x04';
              }
            }
            else if (intKey < (long)local_38) {
              iVar8 = uVar10 - 1;
              if ((int)uVar15 < (int)uVar10) goto LAB_00136b52;
              piVar14 = (int *)0x1;
              cVar11 = '\x04';
            }
            else {
              pCur->aiIdx[pCur->iPage] = (u16)uVar10;
              if (pMVar6->leaf == '\0') {
                cVar11 = '\b';
                uVar15 = uVar10;
              }
              else {
                pCur->curFlags = pCur->curFlags | 2;
                (pCur->info).nKey = local_38;
                (pCur->info).nSize = 0;
                *pRes = 0;
                local_70 = 0;
                cVar11 = '\x01';
              }
            }
          }
          else {
            do {
              if (-1 < (char)*puVar13) {
                puVar13 = puVar13 + 1;
                goto LAB_00136b18;
              }
              puVar13 = puVar13 + 1;
            } while (puVar13 < pMVar6->aDataEnd);
            local_70 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfa1e,
                        "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
            piVar14 = (int *)((ulong)piVar14 & 0xffffffff);
            cVar11 = '\x01';
          }
        } while (cVar11 == '\0');
        if (cVar11 == '\x04') goto LAB_00136be8;
        if (cVar11 != '\b') goto LAB_00136c79;
LAB_00136c12:
        if ((int)uVar15 < (int)(uint)pMVar6->nCell) {
          uVar9 = (ulong)(CONCAT11(pMVar6->aCellIdx[(long)(int)uVar15 * 2],
                                   pMVar6->aCellIdx[(long)(int)uVar15 * 2 + 1]) & pMVar6->maskPage);
        }
        else {
          uVar9 = (ulong)pMVar6->hdrOffset + 8;
        }
        uVar10 = *(uint *)(pMVar6->aData + uVar9);
        pCur->aiIdx[pCur->iPage] = (u16)uVar15;
        local_8c = moveToChild(pCur,uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 |
                                    (uVar10 & 0xff00) << 8 | uVar10 << 0x18);
        cVar11 = (local_8c != 0) * '\x02';
      }
      else {
        uVar15 = 0;
        do {
          puVar13 = pMVar6->aDataOfst;
          uVar9 = (ulong)(CONCAT11(pMVar6->aCellIdx[(long)(int)uVar10 * 2],
                                   pMVar6->aCellIdx[(long)(int)uVar10 * 2 + 1]) & pMVar6->maskPage);
          pbVar1 = puVar13 + uVar9;
          bVar2 = *pbVar1;
          if (pMVar6->max1bytePayload < bVar2) {
            bVar3 = pbVar1[1];
            if ((-1 < (char)bVar3) &&
               (uVar12 = (bVar2 & 0x7f) << 7 | (int)(char)bVar3, uVar12 <= pMVar6->maxLocal)) {
              uVar12 = (*local_78)(uVar12,puVar13 + uVar9 + 2,pIdxKey);
              piVar14 = (int *)(ulong)uVar12;
              goto LAB_00136a11;
            }
            local_6c = (uint)piVar14;
            (*pMVar6->xParseCell)(pMVar6,puVar13 + (uVar9 - pMVar6->childPtrSize),&pCur->info);
            uVar9 = (pCur->info).nKey;
            amt = (u32)uVar9;
            if ((int)amt < 2) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfa67,
                          "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
              local_8c = 0xb;
LAB_001369c6:
              bVar16 = false;
              cVar11 = '\v';
            }
            else {
              pBuf = (uchar *)sqlite3Malloc((ulong)(amt + 0x12));
              cVar11 = '\v';
              if (pBuf == (uchar *)0x0) {
                local_8c = 7;
                goto LAB_001369c6;
              }
              pCur->aiIdx[pCur->iPage] = (u16)uVar10;
              local_8c = accessPayload(pCur,0,amt,pBuf,0);
              pCur->curFlags = pCur->curFlags & 0xfb;
              bVar16 = local_8c == 0;
              if (bVar16) {
                local_6c = (*local_78)(uVar9 & 0xffffffff,pBuf,pIdxKey);
                sqlite3_free(pBuf);
                cVar11 = '\0';
                local_8c = 0;
              }
              else {
                sqlite3_free(pBuf);
              }
            }
            piVar14 = (int *)(ulong)local_6c;
            if (bVar16) goto LAB_00136a11;
          }
          else {
            uVar12 = (*local_78)(bVar2,pbVar1 + 1,pIdxKey);
            piVar14 = (int *)(ulong)uVar12;
LAB_00136a11:
            if ((int)piVar14 < 0) {
              uVar15 = uVar10 + 1;
            }
            else {
              if ((int)piVar14 == 0) {
                piVar14 = (int *)0x0;
                *pRes = 0;
                pCur->aiIdx[pCur->iPage] = (u16)uVar10;
                cVar11 = '\v';
                local_8c = 0xb;
                if (pIdxKey->errCode == '\0') {
                  local_8c = 0;
                }
                goto LAB_00136a64;
              }
              iVar8 = uVar10 - 1;
            }
            cVar11 = '\t';
            if ((int)uVar15 <= iVar8) {
              uVar10 = iVar8 + uVar15 >> 1;
              cVar11 = '\0';
            }
          }
LAB_00136a64:
        } while (cVar11 == '\0');
        if (cVar11 == '\t') {
LAB_00136be8:
          if (pMVar6->leaf == '\0') goto LAB_00136c12;
          pCur->aiIdx[pCur->iPage] = (u16)uVar10;
          *pRes = (int)piVar14;
          local_8c = 0;
          cVar11 = '\v';
        }
      }
LAB_00136c79:
      if (cVar11 != '\0') {
        if ((cVar11 != '\v') && (cVar11 != '\x02')) {
          return local_70;
        }
        (pCur->info).nSize = 0;
        return local_8c;
      }
    } while( true );
  }
LAB_00136d32:
  *pRes = -1;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );
  assert( pCur->eState!=CURSOR_VALID || (pIdxKey==0)==(pCur->curIntKey!=0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pIdxKey==0
   && pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this ase, only a little more slowely */
      if( pCur->info.nKey+1==intKey && !pCur->skipNext ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, pRes);
        if( rc ) return rc;
        if( *pRes==0 ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }
      }
    }
  }

  if( pIdxKey ){
    xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
    pIdxKey->errCode = 0;
    assert( pIdxKey->default_rc==1 
         || pIdxKey->default_rc==0 
         || pIdxKey->default_rc==-1
    );
  }else{
    xRecordCompare = 0; /* All keys are integers */
  }

  rc = moveToRoot(pCur);
  if( rc ){
    return rc;
  }
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage] );
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->isInit );
  assert( pCur->eState==CURSOR_INVALID || pCur->apPage[pCur->iPage]->nCell>0 );
  if( pCur->eState==CURSOR_INVALID ){
    *pRes = -1;
    assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->nCell==0 );
    return SQLITE_OK;
  }
  assert( pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey || pIdxKey );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->apPage[pCur->iPage];
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    pCur->aiIdx[pCur->iPage] = (u16)idx;
    if( xRecordCompare==0 ){
      for(;;){
        i64 nCellKey;
        pCell = findCellPastPtr(pPage, idx);
        if( pPage->intKeyLeaf ){
          while( 0x80 <= *(pCell++) ){
            if( pCell>=pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
          }
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey<intKey ){
          lwr = idx+1;
          if( lwr>upr ){ c = -1; break; }
        }else if( nCellKey>intKey ){
          upr = idx-1;
          if( lwr>upr ){ c = +1; break; }
        }else{
          assert( nCellKey==intKey );
          pCur->aiIdx[pCur->iPage] = (u16)idx;
          if( !pPage->leaf ){
            lwr = idx;
            goto moveto_next_layer;
          }else{
            pCur->curFlags |= BTCF_ValidNKey;
            pCur->info.nKey = nCellKey;
            pCur->info.nSize = 0;
            *pRes = 0;
            return SQLITE_OK;
          }
        }
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
      }
    }else{
      for(;;){
        int nCell;  /* Size of the pCell cell in bytes */
        pCell = findCellPastPtr(pPage, idx);

        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. 
          **
          ** If the record is corrupt, the xRecordCompare routine may read
          ** up to two varints past the end of the buffer. An extra 18 
          ** bytes of padding is allocated at the end of the buffer in
          ** case this happens.  */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          pPage->xParseCell(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          testcase( nCell<0 );   /* True if key size is 2^32 or more */
          testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
          testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
          testcase( nCell==2 );  /* Minimum legal index key size */
          if( nCell<2 ){
            rc = SQLITE_CORRUPT_BKPT;
            goto moveto_finish;
          }
          pCellKey = sqlite3Malloc( nCell+18 );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM_BKPT;
            goto moveto_finish;
          }
          pCur->aiIdx[pCur->iPage] = (u16)idx;
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          pCur->curFlags &= ~BTCF_ValidOvfl;
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = xRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
        assert( 
            (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
         && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
        );
        if( c<0 ){
          lwr = idx+1;
        }else if( c>0 ){
          upr = idx-1;
        }else{
          assert( c==0 );
          *pRes = 0;
          rc = SQLITE_OK;
          pCur->aiIdx[pCur->iPage] = (u16)idx;
          if( pIdxKey->errCode ) rc = SQLITE_CORRUPT;
          goto moveto_finish;
        }
        if( lwr>upr ) break;
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
      }
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->aiIdx[pCur->iPage]<pCur->apPage[pCur->iPage]->nCell );
      pCur->aiIdx[pCur->iPage] = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
moveto_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->aiIdx[pCur->iPage] = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}